

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O2

Vec_Int_t * Gia_VtaFramesToAbs(Vec_Vec_t *vFrames)

{
  Vec_Ptr_t *pVVar1;
  Vec_Int_t *p;
  Vec_Int_t *pVVar2;
  int i;
  int iVar3;
  int iVar4;
  int iVar5;
  int Counter;
  int iVar6;
  
  iVar4 = vFrames->nSize;
  iVar6 = 0;
  iVar5 = iVar4;
  for (iVar3 = 0; iVar3 < iVar5; iVar3 = iVar3 + 1) {
    pVVar1 = Vec_VecEntry(vFrames,iVar3);
    iVar6 = iVar6 + pVVar1->nSize;
    iVar5 = vFrames->nSize;
  }
  p = Vec_IntAlloc(iVar4 + iVar6 + 2);
  Vec_IntPush(p,vFrames->nSize);
  iVar5 = vFrames->nSize;
  iVar4 = iVar5 + 2;
  for (iVar3 = 0; iVar3 < iVar5; iVar3 = iVar3 + 1) {
    pVVar2 = Vec_VecEntryInt(vFrames,iVar3);
    Vec_IntPush(p,iVar4);
    iVar4 = iVar4 + pVVar2->nSize;
    iVar5 = vFrames->nSize;
  }
  Vec_IntPush(p,iVar4);
  iVar4 = vFrames->nSize;
  if (p->nSize != iVar4 + 2) {
    __assert_fail("Vec_IntSize(vAbs) == Vec_VecSize(vFrames) + 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absVta.c"
                  ,0xc1,"Vec_Int_t *Gia_VtaFramesToAbs(Vec_Vec_t *)");
  }
  for (iVar5 = 0; iVar5 < iVar4; iVar5 = iVar5 + 1) {
    pVVar2 = Vec_VecEntryInt(vFrames,iVar5);
    for (iVar4 = 0; iVar4 < pVVar2->nSize; iVar4 = iVar4 + 1) {
      iVar3 = Vec_IntEntry(pVVar2,iVar4);
      Vec_IntPush(p,iVar3);
    }
    iVar4 = vFrames->nSize;
  }
  iVar4 = Vec_IntEntry(p,0);
  iVar4 = Vec_IntEntry(p,iVar4 + 1);
  if (iVar4 == p->nSize) {
    return p;
  }
  __assert_fail("Vec_IntEntry(vAbs, Vec_IntEntry(vAbs,0)+1) == Vec_IntSize(vAbs)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absVta.c"
                ,0xc5,"Vec_Int_t *Gia_VtaFramesToAbs(Vec_Vec_t *)");
}

Assistant:

Vec_Int_t * Gia_VtaFramesToAbs( Vec_Vec_t * vFrames )
{
    Vec_Int_t * vOne, * vAbs;
    int i, k, Entry, nSize;
    vAbs = Vec_IntAlloc( 2 + Vec_VecSize(vFrames) + Vec_VecSizeSize(vFrames) );
    Vec_IntPush( vAbs, Vec_VecSize(vFrames) );
    nSize = Vec_VecSize(vFrames) + 2;
    Vec_VecForEachLevelInt( vFrames, vOne, i )
    {
        Vec_IntPush( vAbs, nSize );
        nSize += Vec_IntSize( vOne );
    }
    Vec_IntPush( vAbs, nSize );
    assert( Vec_IntSize(vAbs) == Vec_VecSize(vFrames) + 2 );
    Vec_VecForEachLevelInt( vFrames, vOne, i )
        Vec_IntForEachEntry( vOne, Entry, k )
            Vec_IntPush( vAbs, Entry );
    assert( Vec_IntEntry(vAbs, Vec_IntEntry(vAbs,0)+1) == Vec_IntSize(vAbs) );
    return vAbs;
}